

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_shar.c
# Opt level: O0

ssize_t archive_write_shar_data_sed(archive_write *a,void *buff,size_t n)

{
  char cVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  archive_string *paVar5;
  char *pcVar6;
  archive_write *paVar7;
  char *pcVar8;
  archive_write *in_RDX;
  char *in_RSI;
  archive *in_RDI;
  size_t written;
  int ret;
  char *buf_end;
  char *buf;
  char *src;
  shar *shar;
  void *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  char *local_38;
  char *local_30;
  archive_write *local_20;
  archive_write *local_8;
  
  lVar2 = *(long *)&in_RDI[1].current_codepage;
  if ((*(int *)(lVar2 + 0x10) == 0) || (in_RDX == (archive_write *)0x0)) {
    local_8 = (archive_write *)0x0;
  }
  else {
    local_8 = in_RDX;
    paVar5 = archive_string_ensure
                       ((archive_string *)
                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),(size_t)in_RDX
                       );
    if (paVar5 == (archive_string *)0x0) {
      archive_set_error(in_RDI,0xc,"Out of memory");
      local_8 = (archive_write *)0xffffffffffffffe2;
    }
    else {
      if (0xfffd < *(ulong *)(lVar2 + 0x68)) {
        iVar4 = __archive_write_output(local_8,in_stack_ffffffffffffffa8,0x195443);
        if (iVar4 != 0) {
          return -0x1e;
        }
        *(undefined8 *)(lVar2 + 0x68) = 0;
      }
      pcVar6 = (char *)(*(long *)(lVar2 + 0x60) + *(long *)(lVar2 + 0x68));
      lVar3 = *(long *)(lVar2 + 0x60);
      local_38 = pcVar6;
      local_30 = in_RSI;
      local_20 = in_RDX;
      if (*(int *)(lVar2 + 4) != 0) {
        local_38 = pcVar6 + 1;
        *pcVar6 = 'X';
        *(undefined4 *)(lVar2 + 4) = 0;
        local_30 = in_RSI;
        local_20 = in_RDX;
      }
      while (paVar7 = (archive_write *)((long)&local_20[-1].format_free + 7),
            local_20 != (archive_write *)0x0) {
        pcVar8 = local_30 + 1;
        cVar1 = *local_30;
        pcVar6 = local_38 + 1;
        *local_38 = cVar1;
        if (cVar1 == '\n') {
          if (paVar7 == (archive_write *)0x0) {
            *(undefined4 *)(lVar2 + 4) = 1;
          }
          else {
            *pcVar6 = 'X';
            pcVar6 = local_38 + 2;
          }
        }
        local_38 = pcVar6;
        local_30 = pcVar8;
        local_20 = paVar7;
        if ((char *)(lVar3 + 0xfffd) <= local_38) {
          *(long *)(lVar2 + 0x68) = (long)local_38 - *(long *)(lVar2 + 0x60);
          iVar4 = __archive_write_output(local_8,in_stack_ffffffffffffffa8,0x195578);
          if (iVar4 != 0) {
            return -0x1e;
          }
          *(undefined8 *)(lVar2 + 0x68) = 0;
          local_38 = *(char **)(lVar2 + 0x60);
        }
      }
      *(long *)(lVar2 + 0x68) = (long)local_38 - *(long *)(lVar2 + 0x60);
    }
  }
  return (ssize_t)local_8;
}

Assistant:

static ssize_t
archive_write_shar_data_sed(struct archive_write *a, const void *buff, size_t n)
{
	static const size_t ensured = 65533;
	struct shar *shar;
	const char *src;
	char *buf, *buf_end;
	int ret;
	size_t written = n;

	shar = (struct shar *)a->format_data;
	if (!shar->has_data || n == 0)
		return (0);

	src = (const char *)buff;

	/*
	 * ensure is the number of bytes in buffer before expanding the
	 * current character.  Each operation writes the current character
	 * and optionally the start-of-new-line marker.  This can happen
	 * twice before entering the loop, so make sure three additional
	 * bytes can be written.
	 */
	if (archive_string_ensure(&shar->work, ensured + 3) == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Out of memory");
		return (ARCHIVE_FATAL);
	}

	if (shar->work.length > ensured) {
		ret = __archive_write_output(a, shar->work.s,
		    shar->work.length);
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		archive_string_empty(&shar->work);
	}
	buf = shar->work.s + shar->work.length;
	buf_end = shar->work.s + ensured;

	if (shar->end_of_line) {
		*buf++ = 'X';
		shar->end_of_line = 0;
	}

	while (n-- != 0) {
		if ((*buf++ = *src++) == '\n') {
			if (n == 0)
				shar->end_of_line = 1;
			else
				*buf++ = 'X';
		}

		if (buf >= buf_end) {
			shar->work.length = buf - shar->work.s;
			ret = __archive_write_output(a, shar->work.s,
			    shar->work.length);
			if (ret != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			archive_string_empty(&shar->work);
			buf = shar->work.s;
		}
	}

	shar->work.length = buf - shar->work.s;

	return (written);
}